

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall CcsTest_SameStep_Test::CcsTest_SameStep_Test(CcsTest_SameStep_Test *this)

{
  CcsTest_SameStep_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CcsTest_SameStep_Test_00264be8;
  return;
}

Assistant:

TEST(CcsTest, SameStep) {
  CcsDomain ccs;
  std::istringstream input("a.b.c d.e: test = 'nope'; a.b.c/d.e: test = 'yep'");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs.build();
  auto ctx = root.builder()
      .add("a", std::vector<std::string>{"b", "c"})
      .add("d", std::vector<std::string>{"e"})
      .build();
  EXPECT_EQ("yep", ctx.getString("test"));
  ctx = root
      .constrain("a", std::vector<std::string>{"b", "c"})
      .constrain("d", std::vector<std::string>{"e"});
  EXPECT_EQ("nope", ctx.getString("test"));
}